

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deque.hpp
# Opt level: O2

void __thiscall
ft::deque<double,ft::allocator<double>>::assign<ft::constDequeIterator<double,32ul>>
          (deque<double,ft::allocator<double>> *this,constDequeIterator<double,_32UL> *first,
          constDequeIterator<double,_32UL> *last,type *param_3)

{
  difference_type dVar1;
  type *in_R8;
  constDequeIterator<double,_32UL> local_170;
  constDequeIterator<double,_32UL> local_148;
  constDequeIterator<double,_32UL> local_120;
  constDequeIterator<double,_32UL> local_f8;
  constDequeIterator<double,_32UL> local_d0;
  constDequeIterator<double,_32UL> local_a8;
  constDequeIterator<double,_32UL> local_80;
  undefined1 local_58 [8];
  constDequeIterator<double,_32UL> middle;
  
  deque<double,_ft::allocator<double>_>::clear((deque<double,_ft::allocator<double>_> *)this);
  constDequeIterator<double,_32UL>::constDequeIterator(&local_a8,first);
  constDequeIterator<double,_32UL>::constDequeIterator(&local_170,first);
  constDequeIterator<double,_32UL>::constDequeIterator(&local_148,last);
  dVar1 = distance<ft::constDequeIterator<double,32ul>>(&local_170,&local_148,(type *)0x0);
  next<ft::constDequeIterator<double,32ul>>
            ((constDequeIterator<double,_32UL> *)local_58,(ft *)&local_a8,
             (constDequeIterator<double,_32UL> *)(dVar1 / 2),0,in_R8);
  while (middle.super_dequeIterator<double,_32UL>._vptr_dequeIterator !=
         (_func_int **)(last->super_dequeIterator<double,_32UL>).m_cur) {
    deque<double,_ft::allocator<double>_>::push_back
              ((deque<double,_ft::allocator<double>_> *)this,
               (value_type_conflict1 *)middle.super_dequeIterator<double,_32UL>._vptr_dequeIterator)
    ;
    middle.super_dequeIterator<double,_32UL>._vptr_dequeIterator =
         middle.super_dequeIterator<double,_32UL>._vptr_dequeIterator + 1;
    if (middle.super_dequeIterator<double,_32UL>._vptr_dequeIterator ==
        (_func_int **)middle.super_dequeIterator<double,_32UL>.m_first) {
      middle.super_dequeIterator<double,_32UL>._vptr_dequeIterator =
           (_func_int **)middle.super_dequeIterator<double,_32UL>.m_last[1];
      middle.super_dequeIterator<double,_32UL>.m_first =
           (pointer)(middle.super_dequeIterator<double,_32UL>._vptr_dequeIterator + 0x20);
      middle.super_dequeIterator<double,_32UL>.m_cur =
           (pointer)middle.super_dequeIterator<double,_32UL>._vptr_dequeIterator;
      middle.super_dequeIterator<double,_32UL>.m_last =
           middle.super_dequeIterator<double,_32UL>.m_last + 1;
    }
  }
  constDequeIterator<double,_32UL>::constDequeIterator(&local_80,first);
  constDequeIterator<double,_32UL>::constDequeIterator(&local_f8,first);
  constDequeIterator<double,_32UL>::constDequeIterator(&local_d0,last);
  dVar1 = distance<ft::constDequeIterator<double,32ul>>(&local_f8,&local_d0,(type *)0x0);
  next<ft::constDequeIterator<double,32ul>>
            (&local_120,(ft *)&local_80,(constDequeIterator<double,_32UL> *)(dVar1 / 2),0,in_R8);
  middle.super_dequeIterator<double,_32UL>.m_cur =
       local_120.super_dequeIterator<double,_32UL>.m_first;
  middle.super_dequeIterator<double,_32UL>.m_first =
       local_120.super_dequeIterator<double,_32UL>.m_last;
  middle.super_dequeIterator<double,_32UL>.m_last =
       (pointer)local_120.super_dequeIterator<double,_32UL>.m_node;
  while (local_120.super_dequeIterator<double,_32UL>.m_cur !=
         (first->super_dequeIterator<double,_32UL>).m_cur) {
    if (local_120.super_dequeIterator<double,_32UL>.m_cur ==
        middle.super_dequeIterator<double,_32UL>.m_cur) {
      middle.super_dequeIterator<double,_32UL>.m_cur =
           (pointer)middle.super_dequeIterator<double,_32UL>.m_last[-1];
      local_120.super_dequeIterator<double,_32UL>.m_cur =
           middle.super_dequeIterator<double,_32UL>.m_cur + 0x20;
      middle.super_dequeIterator<double,_32UL>.m_first =
           local_120.super_dequeIterator<double,_32UL>.m_cur;
      middle.super_dequeIterator<double,_32UL>.m_last =
           middle.super_dequeIterator<double,_32UL>.m_last + -1;
    }
    middle.super_dequeIterator<double,_32UL>._vptr_dequeIterator =
         (_func_int **)local_120.super_dequeIterator<double,_32UL>.m_cur + -1;
    deque<double,_ft::allocator<double>_>::push_front
              ((deque<double,_ft::allocator<double>_> *)this,
               (value_type_conflict1 *)middle.super_dequeIterator<double,_32UL>._vptr_dequeIterator)
    ;
    local_120.super_dequeIterator<double,_32UL>.m_cur =
         (pointer)middle.super_dequeIterator<double,_32UL>._vptr_dequeIterator;
  }
  return;
}

Assistant:

void assign(Iterator first, Iterator last,
				typename ft::_void_t<typename ft::iterator_traits<Iterator>::iterator_category>::type * = 0) {
		this->clear();

		Iterator	middle = ft::next(first, ft::distance(first, last) / 2);
		while (middle != last) {
			this->push_back(*middle);
			++middle;
		}

		middle = ft::next(first, ft::distance(first, last) / 2);
		while (middle != first) {
			--middle;
			this->push_front(*middle);
		}
	}